

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_embed_optimize_for.pb.cc
# Opt level: O2

void proto2_unittest::TestEmbedOptimizedForSize::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  Message *from;
  Message *this;
  char *failure_msg;
  void *pvVar2;
  int line;
  Arena *arena;
  TestEmbedOptimizedForSize *_this;
  TestEmbedOptimizedForSize *local_30;
  MessageLite *local_28 [2];
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  local_30 = (TestEmbedOptimizedForSize *)to_msg;
  local_28[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto2_unittest::TestEmbedOptimizedForSize_const*,proto2_unittest::TestEmbedOptimizedForSize*>
                          ((TestEmbedOptimizedForSize **)local_28,&local_30,"&from != _this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    google::protobuf::RepeatedPtrField<proto2_unittest::TestOptimizedForSize>::MergeFrom
              (&(local_30->field_0)._impl_.repeated_message_,
               (RepeatedPtrField<proto2_unittest::TestOptimizedForSize> *)
               &from_msg[1]._internal_metadata_);
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((uVar1 & 1) != 0) {
      from = (Message *)from_msg[3]._vptr_MessageLite;
      if (from == (Message *)0x0) {
        failure_msg = "from._impl_.optional_message_ != nullptr";
        line = 0x18a;
        goto LAB_00a4f97e;
      }
      this = *(Message **)((long)&local_30->field_0 + 0x20);
      if (this == (Message *)0x0) {
        pvVar2 = google::protobuf::Arena::CopyConstruct<proto2_unittest::TestOptimizedForSize>
                           (arena,from);
        *(void **)((long)&local_30->field_0 + 0x20) = pvVar2;
      }
      else {
        google::protobuf::Message::MergeFrom(this,from);
      }
    }
    (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
         (local_30->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(local_30->super_Message).super_MessageLite._internal_metadata_,
               &from_msg->_internal_metadata_);
    return;
  }
  line = 0x182;
LAB_00a4f97e:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_embed_optimize_for.pb.cc"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28);
}

Assistant:

void TestEmbedOptimizedForSize::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestEmbedOptimizedForSize*>(&to_msg);
  auto& from = static_cast<const TestEmbedOptimizedForSize&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestEmbedOptimizedForSize)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_message()->MergeFrom(
      from._internal_repeated_message());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    ABSL_DCHECK(from._impl_.optional_message_ != nullptr);
    if (_this->_impl_.optional_message_ == nullptr) {
      _this->_impl_.optional_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_message_);
    } else {
      _this->_impl_.optional_message_->MergeFrom(*from._impl_.optional_message_);
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}